

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall
NLProblemBuilderTest_OnHeader_Test::TestBody(NLProblemBuilderTest_OnHeader_Test *this)

{
  MockProblemBuilder *in_RDI;
  NLHeader h;
  NLHeader *in_stack_fffffffffffffe88;
  NLHeader *h_00;
  NLProblemBuilder<MockProblemBuilder> *this_00;
  RefMatcher<mp::NLHeader_&> *in_stack_fffffffffffffeb8;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  MockSpec<void_(const_mp::NLProblemInfo_&)> *in_stack_ffffffffffffffa0;
  
  h_00 = (NLHeader *)&stack0xfffffffffffffee8;
  mp::NLHeader::NLHeader((NLHeader *)in_RDI);
  this_00 = (NLProblemBuilder<MockProblemBuilder> *)
            &(((NLProblemInfo *)&in_RDI->gmock1_suffixes_146)->super_NLProblemInfo_C).num_rand_vars;
  testing::Ref<mp::NLHeader>(in_stack_fffffffffffffe88);
  testing::internal::RefMatcher::operator_cast_to_Matcher(in_stack_fffffffffffffeb8);
  MockProblemBuilder::gmock_SetInfo
            (in_RDI,(Matcher<const_mp::NLProblemInfo_&> *)in_stack_fffffffffffffe88);
  testing::internal::MockSpec<void_(const_mp::NLProblemInfo_&)>::InternalExpectedAt
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  testing::Matcher<const_mp::NLProblemInfo_&>::~Matcher
            ((Matcher<const_mp::NLProblemInfo_&> *)0x17d672);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::OnHeader(this_00,h_00);
  return;
}

Assistant:

TEST_F(NLProblemBuilderTest, OnHeader) {
  NLHeader h;
  EXPECT_CALL(builder, SetInfo(testing::Ref(h)));
  adapter.OnHeader(h);
}